

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.h
# Opt level: O1

void __thiscall RtMidiError::~RtMidiError(RtMidiError *this)

{
  ~RtMidiError(this);
  operator_delete(this,0x30);
  return;
}

Assistant:

virtual ~RtMidiError( void ) throw() {}